

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int is_put_or_delete_method(mg_connection *conn)

{
  char *__s1;
  int iVar1;
  byte local_21;
  char *s;
  mg_connection *conn_local;
  
  if ((conn == (mg_connection *)0x0) ||
     (__s1 = (conn->request_info).request_method, __s1 == (char *)0x0)) {
    conn_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(__s1,"PUT");
    local_21 = 1;
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1,"DELETE");
      local_21 = 1;
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1,"MKCOL");
        local_21 = 1;
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1,"PATCH");
          local_21 = 1;
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1,"LOCK");
            local_21 = 1;
            if (iVar1 != 0) {
              iVar1 = strcmp(__s1,"UNLOCK");
              local_21 = 1;
              if (iVar1 != 0) {
                iVar1 = strcmp(__s1,"PROPPATCH");
                local_21 = 1;
                if (iVar1 != 0) {
                  iVar1 = strcmp(__s1,"MOVE");
                  local_21 = 1;
                  if (iVar1 != 0) {
                    iVar1 = strcmp(__s1,"COPY");
                    local_21 = iVar1 != 0 ^ 0xff;
                  }
                }
              }
            }
          }
        }
      }
    }
    conn_local._4_4_ = (uint)(local_21 & 1);
  }
  return conn_local._4_4_;
}

Assistant:

static int
is_put_or_delete_method(const struct mg_connection *conn)
{
	if (conn) {
		const char *s = conn->request_info.request_method;
		if (s != NULL) {
			/* PUT, DELETE, MKCOL, PATCH, LOCK, UNLOCK, PROPPATCH, MOVE, COPY */
			return (!strcmp(s, "PUT") || !strcmp(s, "DELETE")
			        || !strcmp(s, "MKCOL") || !strcmp(s, "PATCH")
			        || !strcmp(s, "LOCK") || !strcmp(s, "UNLOCK")
			        || !strcmp(s, "PROPPATCH") || !strcmp(s, "MOVE")
			        || !strcmp(s, "COPY"));
		}
	}
	return 0;
}